

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O0

int ndn_hmac_make_key(ndn_hmac_key_t *hmac_key,uint32_t key_id,uint8_t *input_value,
                     uint32_t input_size,uint8_t *personalization,uint32_t personalization_size,
                     uint8_t *seed_value,uint32_t seed_size,uint8_t *additional_value,
                     uint32_t additional_size,uint32_t salt_size)

{
  long lVar1;
  ulong uVar2;
  uint8_t *seed_value_00;
  undefined8 auStack_a0 [2];
  uint32_t auStack_90 [2];
  ulong local_88;
  uint8_t *local_80;
  uint8_t local_78 [8];
  uint8_t key_bytes [32];
  int r;
  unsigned_long __vla_expr0;
  uint32_t personalization_size_local;
  uint8_t *personalization_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  uint32_t key_id_local;
  ndn_hmac_key_t *hmac_key_local;
  
  hmac_key->key_id = key_id;
  local_88 = (ulong)salt_size;
  lVar1 = -((ulong)salt_size + 0xf & 0xfffffffffffffff0);
  local_80 = (uint8_t *)((long)&local_88 + lVar1);
  *(uint8_t **)((long)auStack_a0 + lVar1 + 8) = additional_value;
  *(uint32_t *)((long)auStack_90 + lVar1) = additional_size;
  *(undefined8 *)((long)auStack_a0 + lVar1) = 0x11f4bf;
  key_bytes._28_4_ =
       ndn_hmacprng(personalization,personalization_size,(uint8_t *)((long)&local_88 + lVar1),
                    salt_size,seed_value,seed_size,*(uint8_t **)((long)auStack_a0 + lVar1 + 8),
                    *(uint32_t *)((long)auStack_90 + lVar1));
  if (key_bytes._28_4_ == 0) {
    *(undefined8 *)((long)auStack_90 + lVar1) = 0x11f4ef;
    memset(local_78,0,0x20);
    seed_value_00 = local_80;
    uVar2 = local_88;
    *(undefined8 *)((long)auStack_a0 + lVar1 + 8) = 0;
    *(undefined4 *)((long)auStack_90 + lVar1) = 0;
    *(undefined8 *)((long)auStack_a0 + lVar1) = 0x11f527;
    key_bytes._28_4_ =
         ndn_hkdf(input_value,input_size,local_78,0x20,seed_value_00,(uint32_t)uVar2,
                  *(uint8_t **)((long)auStack_a0 + lVar1 + 8),
                  *(uint32_t *)((long)auStack_90 + lVar1));
    if (key_bytes._28_4_ == 0) {
      *(undefined8 *)((long)auStack_90 + lVar1) = 0x11f556;
      ndn_hmac_load_key(hmac_key,local_78,0x20);
      hmac_key_local._4_4_ = 0;
    }
    else {
      hmac_key_local._4_4_ = -0x19;
    }
  }
  else {
    hmac_key_local._4_4_ = -0x19;
  }
  return hmac_key_local._4_4_;
}

Assistant:

int
ndn_hmac_make_key(ndn_hmac_key_t* hmac_key, uint32_t key_id,
                  const uint8_t* input_value, uint32_t input_size,
                  const uint8_t* personalization, uint32_t personalization_size,
                  const uint8_t* seed_value, uint32_t seed_size,
                  const uint8_t* additional_value, uint32_t additional_size,
                  uint32_t salt_size)
{
  hmac_key->key_id = key_id;
  uint8_t salt[salt_size];
  int r = ndn_hmacprng(personalization, personalization_size,
                       salt, sizeof(salt), seed_value, seed_size,
                       additional_value, additional_size);

  if (r != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;

  uint8_t key_bytes[NDN_SEC_SHA256_HASH_SIZE] = {0};
  r = ndn_hkdf(input_value, input_size, key_bytes, NDN_SEC_SHA256_HASH_SIZE,
               salt, sizeof(salt), NULL, 0);
  if (r != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  ndn_hmac_load_key(hmac_key, key_bytes, NDN_SEC_SHA256_HASH_SIZE);
  return NDN_SUCCESS;
}